

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::TypeParameterDeclarationSyntax::TypeParameterDeclarationSyntax
          (TypeParameterDeclarationSyntax *this,Token keyword,Token typeKeyword,
          ForwardTypeRestrictionSyntax *typeRestriction,
          SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *declarators)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar5 = typeKeyword._0_8_;
  uVar6 = keyword._0_8_;
  (this->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind = TypeParameterDeclaration;
  (this->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->super_ParameterDeclarationBaseSyntax).keyword.kind = (short)uVar6;
  (this->super_ParameterDeclarationBaseSyntax).keyword.field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->super_ParameterDeclarationBaseSyntax).keyword.numFlags =
       (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->super_ParameterDeclarationBaseSyntax).keyword.rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->super_ParameterDeclarationBaseSyntax).keyword.info = keyword.info;
  (this->typeKeyword).kind = (short)uVar5;
  (this->typeKeyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->typeKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->typeKeyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->typeKeyword).info = typeKeyword.info;
  this->typeRestriction = typeRestriction;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d1c58;
  sVar2 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar2;
  if (typeRestriction != (ForwardTypeRestrictionSyntax *)0x0) {
    (typeRestriction->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->declarators).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

TypeParameterDeclarationSyntax(Token keyword, Token typeKeyword, ForwardTypeRestrictionSyntax* typeRestriction, const SeparatedSyntaxList<TypeAssignmentSyntax>& declarators) :
        ParameterDeclarationBaseSyntax(SyntaxKind::TypeParameterDeclaration, keyword), typeKeyword(typeKeyword), typeRestriction(typeRestriction), declarators(declarators) {
        if (this->typeRestriction) this->typeRestriction->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }